

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool __thiscall
duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::CanStore
          (BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *this,
          idx_t data_bytes,idx_t meta_bytes)

{
  unsigned_long uVar1;
  idx_t iVar2;
  unsigned_long uVar3;
  idx_t iVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  unsigned_long required_meta_bytes;
  unsigned_long required_data_bytes;
  
  uVar1 = UnsafeNumericCast<unsigned_long,long,void>
                    ((*(long *)(in_RDI + 0x40) + in_RSI) - *(long *)(in_RDI + 0x40));
  uVar1 = AlignValue<unsigned_long,_8UL>(uVar1);
  iVar2 = CompressionInfo::GetBlockSize((CompressionInfo *)0xa9f2bd);
  uVar3 = UnsafeNumericCast<unsigned_long,long,void>
                    (*(long *)(in_RDI + 0x48) - *(long *)(in_RDI + 0x40));
  iVar4 = CompressionInfo::GetBlockSize((CompressionInfo *)0xa9f30c);
  return uVar1 + (iVar2 - uVar3) + in_RDX <= iVar4 - 8;
}

Assistant:

bool CanStore(idx_t data_bytes, idx_t meta_bytes) {
		auto required_data_bytes = AlignValue<idx_t>(UnsafeNumericCast<idx_t>((data_ptr + data_bytes) - data_ptr));
		auto required_meta_bytes = info.GetBlockSize() - UnsafeNumericCast<idx_t>(metadata_ptr - data_ptr) + meta_bytes;

		return required_data_bytes + required_meta_bytes <=
		       info.GetBlockSize() - BitpackingPrimitives::BITPACKING_HEADER_SIZE;
	}